

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.c
# Opt level: O1

int ndn_signature_info_tlv_decode(ndn_decoder_t *decoder,ndn_signature_t *signature)

{
  byte bVar1;
  uint uVar2;
  uint8_t *puVar3;
  undefined8 uVar4;
  bool bVar5;
  uint64_t *value;
  _Bool _Var6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t local_34 [2];
  uint32_t probe;
  
  signature->enable_KeyLocator = '\0';
  signature->enable_ValidityPeriod = '\0';
  signature->is_interest = false;
  signature->enable_SignatureNonce = '\0';
  signature->signature_nonce = 0;
  signature->enable_Timestamp = '\0';
  signature->timestamp = 0;
  signature->enable_Seqnum = '\0';
  signature->seqnum = 0;
  local_34[0] = 0;
  puVar3 = decoder->input_value;
  uVar2 = decoder->offset;
  bVar1 = puVar3[uVar2];
  uVar8 = decoder->input_size;
  if (bVar1 < 0xfd) {
    iVar7 = 1;
    local_34[0] = (uint)bVar1;
LAB_0010f97f:
    decoder->offset = iVar7 + uVar2;
    iVar7 = 0;
    bVar5 = true;
  }
  else {
    if (2 < uVar8 - uVar2 && bVar1 == 0xfd) {
      local_34[0] = (uint32_t)CONCAT11(puVar3[uVar2 + 1],puVar3[uVar2 + 2]);
      iVar7 = 3;
      goto LAB_0010f97f;
    }
    if (4 < uVar8 - uVar2 && bVar1 == 0xfe) {
      local_34[0] = (uint)puVar3[uVar2 + 4] |
                    (uint)puVar3[uVar2 + 3] << 8 |
                    (uint)puVar3[uVar2 + 2] << 0x10 | (uint)puVar3[uVar2 + 1] << 0x18;
      iVar7 = 5;
      goto LAB_0010f97f;
    }
    iVar7 = -0xe;
    bVar5 = false;
  }
  if (!bVar5) {
    return iVar7;
  }
  if (local_34[0] == 0x16) {
    _Var6 = false;
  }
  else {
    if (local_34[0] != 0x2c) {
      return -0xc;
    }
    _Var6 = true;
  }
  signature->is_interest = _Var6;
  uVar2 = decoder->offset;
  bVar1 = puVar3[uVar2];
  uVar10 = (uint)bVar1;
  if (bVar1 < 0xfd) {
    iVar7 = 1;
LAB_0010fa64:
    decoder->offset = iVar7 + uVar2;
    iVar7 = 0;
    bVar5 = true;
  }
  else {
    if (2 < uVar8 - uVar2 && bVar1 == 0xfd) {
      uVar10 = (uint)CONCAT11(puVar3[uVar2 + 1],puVar3[uVar2 + 2]);
      iVar7 = 3;
      goto LAB_0010fa64;
    }
    if (4 < uVar8 - uVar2 && uVar10 == 0xfe) {
      uVar10 = (uint)puVar3[uVar2 + 4] |
               (uint)puVar3[uVar2 + 3] << 8 |
               (uint)puVar3[uVar2 + 2] << 0x10 | (uint)puVar3[uVar2 + 1] << 0x18;
      iVar7 = 5;
      goto LAB_0010fa64;
    }
    iVar7 = -0xe;
    uVar10 = 0;
    bVar5 = false;
  }
  if (!bVar5) {
    return iVar7;
  }
  uVar2 = decoder->offset;
  uVar9 = (uint)puVar3[uVar2];
  if (puVar3[uVar2] < 0xfd) {
    iVar7 = 1;
    local_34[0] = uVar9;
LAB_0010fb29:
    decoder->offset = iVar7 + uVar2;
    iVar7 = 0;
    bVar5 = true;
  }
  else {
    if (2 < uVar8 - uVar2 && uVar9 == 0xfd) {
      local_34[0] = (uint32_t)CONCAT11(puVar3[uVar2 + 1],puVar3[uVar2 + 2]);
      iVar7 = 3;
      goto LAB_0010fb29;
    }
    if (4 < uVar8 - uVar2 && uVar9 == 0xfe) {
      local_34[0] = (uint)puVar3[uVar2 + 4] |
                    (uint)puVar3[uVar2 + 3] << 8 |
                    (uint)puVar3[uVar2 + 2] << 0x10 | (uint)puVar3[uVar2 + 1] << 0x18;
      iVar7 = 5;
      goto LAB_0010fb29;
    }
    iVar7 = -0xe;
    bVar5 = false;
  }
  if (!bVar5) {
    return iVar7;
  }
  uVar9 = decoder->offset;
  bVar1 = puVar3[uVar9];
  if (bVar1 < 0xfd) {
    iVar7 = 1;
    local_34[0] = (uint)bVar1;
  }
  else if (uVar8 - uVar9 < 3 || bVar1 != 0xfd) {
    if (uVar8 - uVar9 < 5 || bVar1 != 0xfe) {
      iVar7 = -0xe;
      bVar5 = false;
      goto LAB_0010fc0b;
    }
    local_34[0] = (uint)puVar3[uVar9 + 4] |
                  (uint)puVar3[uVar9 + 3] << 8 |
                  (uint)puVar3[uVar9 + 2] << 0x10 | (uint)puVar3[uVar9 + 1] << 0x18;
    iVar7 = 5;
  }
  else {
    local_34[0] = (uint32_t)CONCAT11(puVar3[uVar9 + 1],puVar3[uVar9 + 2]);
    iVar7 = 3;
  }
  decoder->offset = iVar7 + uVar9;
  iVar7 = 0;
  bVar5 = true;
LAB_0010fc0b:
  if (bVar5) {
    iVar7 = -10;
    if (decoder->offset + 1 <= uVar8) {
      signature->sig_type = puVar3[decoder->offset];
      decoder->offset = decoder->offset + 1;
      uVar8 = decoder->offset;
      if (uVar8 < uVar10 + uVar2) {
        do {
          puVar3 = decoder->input_value;
          bVar1 = puVar3[uVar8];
          if (bVar1 < 0xfd) {
            iVar7 = 1;
            local_34[0] = (uint)bVar1;
LAB_0010fd20:
            decoder->offset = uVar8 + iVar7;
            iVar7 = 0;
            bVar5 = true;
          }
          else {
            uVar9 = decoder->input_size - uVar8;
            if ((bVar1 == 0xfd) && (2 < uVar9)) {
              local_34[0] = (uint32_t)CONCAT11(puVar3[uVar8 + 1],puVar3[uVar8 + 2]);
              iVar7 = 3;
              goto LAB_0010fd20;
            }
            bVar5 = false;
            iVar7 = -0xe;
            if ((bVar1 == 0xfe) && (4 < uVar9)) {
              local_34[0] = (uint)puVar3[uVar8 + 4] |
                            (uint)puVar3[uVar8 + 3] << 8 |
                            (uint)puVar3[uVar8 + 2] << 0x10 | (uint)puVar3[uVar8 + 1] << 0x18;
              iVar7 = 5;
              goto LAB_0010fd20;
            }
          }
          if (!bVar5) {
            return iVar7;
          }
          if ((int)local_34[0] < 0x28) {
            if (local_34[0] == 10) {
              signature->enable_SignatureNonce = '\x01';
              iVar7 = decoder_get_length(decoder,local_34);
              if (iVar7 != 0) {
                return iVar7;
              }
              if (local_34[0] != 4) {
                return -0xd;
              }
              iVar7 = decoder_get_uint32_value(decoder,&signature->signature_nonce);
            }
            else {
              if (local_34[0] != 0x1c) {
                return -0xc;
              }
              signature->enable_KeyLocator = '\x01';
              iVar7 = decoder_get_length(decoder,local_34);
              if (iVar7 != 0) {
                return iVar7;
              }
              iVar7 = ndn_name_tlv_decode(decoder,&signature->key_locator_name);
            }
LAB_0010fee4:
            if (iVar7 != 0) {
              return iVar7;
            }
          }
          else {
            if (local_34[0] == 0x28) {
              signature->enable_Timestamp = '\x01';
              iVar7 = decoder_get_length(decoder,local_34);
              value = &signature->timestamp;
joined_r0x0010fed3:
              if (iVar7 != 0) {
                return iVar7;
              }
              iVar7 = decoder_get_uint_value(decoder,local_34[0],value);
              goto LAB_0010fee4;
            }
            if (local_34[0] == 0x2a) {
              signature->enable_Seqnum = '\x01';
              iVar7 = decoder_get_length(decoder,local_34);
              value = &signature->seqnum;
              goto joined_r0x0010fed3;
            }
            if (local_34[0] != 0xfd) {
              return -0xc;
            }
            signature->enable_ValidityPeriod = '\x01';
            iVar7 = decoder_get_length(decoder,local_34);
            if (iVar7 != 0) {
              return iVar7;
            }
            iVar7 = decoder_get_type(decoder,local_34);
            if (iVar7 != 0) {
              return iVar7;
            }
            iVar7 = decoder_get_length(decoder,local_34);
            if (iVar7 != 0) {
              return iVar7;
            }
            uVar8 = decoder->offset;
            if ((int)(decoder->input_size - uVar8) < 0xf) {
              return -10;
            }
            uVar4 = *(undefined8 *)(decoder->input_value + uVar8);
            *(undefined8 *)((signature->validity_period).not_before + 7) =
                 *(undefined8 *)(decoder->input_value + (ulong)uVar8 + 7);
            *(undefined8 *)(signature->validity_period).not_before = uVar4;
            decoder->offset = decoder->offset + 0xf;
            iVar7 = decoder_get_type(decoder,local_34);
            if (iVar7 != 0) {
              return iVar7;
            }
            iVar7 = decoder_get_length(decoder,local_34);
            if (iVar7 != 0) {
              return iVar7;
            }
            uVar8 = decoder->offset;
            if ((int)(decoder->input_size - uVar8) < 0xf) {
              return -10;
            }
            uVar4 = *(undefined8 *)(decoder->input_value + uVar8);
            *(undefined8 *)((signature->validity_period).not_after + 7) =
                 *(undefined8 *)(decoder->input_value + (ulong)uVar8 + 7);
            *(undefined8 *)(signature->validity_period).not_after = uVar4;
            decoder->offset = decoder->offset + 0xf;
          }
          uVar8 = decoder->offset;
        } while (uVar8 < uVar10 + uVar2);
      }
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int
ndn_signature_info_tlv_decode(ndn_decoder_t* decoder, ndn_signature_t* signature)
{
  int ret_val = -1;
  ndn_signature_init(signature, false);

  uint32_t probe = 0;
  ret_val = decoder_get_type(decoder, &probe);
  if (ret_val != NDN_SUCCESS) return ret_val;
  if (probe == TLV_SignatureInfo) {
    signature->is_interest = false;
  }
  else if (probe == TLV_InterestSignatureInfo) {
    signature->is_interest = true;
  }
  else {
    return NDN_WRONG_TLV_TYPE;
  }
  uint32_t value_length = 0;
  ret_val = decoder_get_length(decoder, &value_length);
  if (ret_val != NDN_SUCCESS) return ret_val;
  uint32_t value_starting = decoder->offset;

  // signature type
  ret_val = decoder_get_type(decoder, &probe);
  if (ret_val != NDN_SUCCESS) return ret_val;
  ret_val = decoder_get_length(decoder, &probe);
  if (ret_val != NDN_SUCCESS) return ret_val;
  ret_val = decoder_get_byte_value(decoder, &signature->sig_type);
  if (ret_val != NDN_SUCCESS) return ret_val;

  while (decoder->offset < value_starting + value_length) {
    ret_val = decoder_get_type(decoder, &probe);
    if (ret_val != NDN_SUCCESS) return ret_val;
    if (probe == TLV_KeyLocator) {
      signature->enable_KeyLocator = 1;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = ndn_name_tlv_decode(decoder, &signature->key_locator_name);
      if (ret_val != NDN_SUCCESS) return ret_val;
    }
    else if (probe == TLV_ValidityPeriod) {
      signature->enable_ValidityPeriod = 1;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;

      ret_val = decoder_get_type(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_raw_buffer_value(decoder, signature->validity_period.not_before, 15);
      if (ret_val != NDN_SUCCESS) return ret_val;

      ret_val = decoder_get_type(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_raw_buffer_value(decoder, signature->validity_period.not_after, 15);
      if (ret_val != NDN_SUCCESS) return ret_val;
    }
    else if (probe == TLV_Nonce) {
      signature->enable_SignatureNonce = 1;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      if (probe != 4) {
        return NDN_WRONG_TLV_LENGTH;
      }
      ret_val = decoder_get_uint32_value(decoder, &signature->signature_nonce);
      if (ret_val != NDN_SUCCESS) return ret_val;
    }
    else if (probe == TLV_Timestamp) {
      signature->enable_Timestamp = 1;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_uint_value(decoder, probe, &signature->timestamp);
      if (ret_val != NDN_SUCCESS) return ret_val;
    }
    else if (probe == TLV_SeqNum) {
      signature->enable_Seqnum = 1;
      ret_val = decoder_get_length(decoder, &probe);
      if (ret_val != NDN_SUCCESS) return ret_val;
      ret_val = decoder_get_uint_value(decoder, probe, &signature->seqnum);
      if (ret_val != NDN_SUCCESS) return ret_val;
    }
    else
      return NDN_WRONG_TLV_TYPE;
  }
  return 0;
}